

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5SegIterNextFrom(Fts5Index *p,Fts5SegIter *pIter,i64 iMatch)

{
  Fts5DlidxIter *pIter_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  i64 iVar4;
  int local_34;
  int bMove;
  int iLeafPgno;
  Fts5DlidxIter *pDlidx;
  int bRev;
  i64 iMatch_local;
  Fts5SegIter *pIter_local;
  Fts5Index *p_local;
  
  uVar2 = pIter->flags & 2;
  pIter_00 = pIter->pDlidx;
  local_34 = pIter->iLeafPgno;
  if (uVar2 == 0) {
    while( true ) {
      iVar3 = fts5DlidxIterEof(p,pIter_00);
      bVar1 = false;
      if (iVar3 == 0) {
        iVar4 = fts5DlidxIterRowid(pIter_00);
        bVar1 = iVar4 < iMatch;
      }
      if (!bVar1) break;
      local_34 = fts5DlidxIterPgno(pIter_00);
      fts5DlidxIterNext(p,pIter_00);
    }
    bVar1 = pIter->iLeafPgno < local_34;
    if (bVar1) {
      fts5SegIterGotoPage(p,pIter,local_34);
    }
  }
  else {
    while( true ) {
      iVar3 = fts5DlidxIterEof(p,pIter_00);
      bVar1 = false;
      if (iVar3 == 0) {
        iVar4 = fts5DlidxIterRowid(pIter_00);
        bVar1 = iMatch < iVar4;
      }
      if (!bVar1) break;
      fts5DlidxIterPrev(p,pIter_00);
    }
    iVar3 = fts5DlidxIterPgno(pIter_00);
    bVar1 = iVar3 < pIter->iLeafPgno;
    if (bVar1) {
      pIter->iLeafPgno = iVar3 + 1;
      fts5SegIterReverseNewPage(p,pIter);
    }
  }
  bVar1 = !bVar1;
  do {
    if ((bVar1) && (p->rc == 0)) {
      (*pIter->xNext)(p,pIter,(int *)0x0);
    }
  } while ((((pIter->pLeaf != (Fts5Data *)0x0) && ((uVar2 != 0 || (pIter->iRowid < iMatch)))) &&
           ((uVar2 == 0 || (iMatch < pIter->iRowid)))) && (bVar1 = true, p->rc == 0));
  return;
}

Assistant:

static void fts5SegIterNextFrom(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5SegIter *pIter,             /* Iterator to advance */
  i64 iMatch                      /* Advance iterator at least this far */
){
  int bRev = (pIter->flags & FTS5_SEGITER_REVERSE);
  Fts5DlidxIter *pDlidx = pIter->pDlidx;
  int iLeafPgno = pIter->iLeafPgno;
  int bMove = 1;

  assert( pIter->flags & FTS5_SEGITER_ONETERM );
  assert( pIter->pDlidx );
  assert( pIter->pLeaf );

  if( bRev==0 ){
    while( !fts5DlidxIterEof(p, pDlidx) && iMatch>fts5DlidxIterRowid(pDlidx) ){
      iLeafPgno = fts5DlidxIterPgno(pDlidx);
      fts5DlidxIterNext(p, pDlidx);
    }
    assert_nc( iLeafPgno>=pIter->iLeafPgno || p->rc );
    if( iLeafPgno>pIter->iLeafPgno ){
      fts5SegIterGotoPage(p, pIter, iLeafPgno);
      bMove = 0;
    }
  }else{
    assert( pIter->pNextLeaf==0 );
    assert( iMatch<pIter->iRowid );
    while( !fts5DlidxIterEof(p, pDlidx) && iMatch<fts5DlidxIterRowid(pDlidx) ){
      fts5DlidxIterPrev(p, pDlidx);
    }
    iLeafPgno = fts5DlidxIterPgno(pDlidx);

    assert( fts5DlidxIterEof(p, pDlidx) || iLeafPgno<=pIter->iLeafPgno );

    if( iLeafPgno<pIter->iLeafPgno ){
      pIter->iLeafPgno = iLeafPgno+1;
      fts5SegIterReverseNewPage(p, pIter);
      bMove = 0;
    }
  }

  do{
    if( bMove && p->rc==SQLITE_OK ) pIter->xNext(p, pIter, 0);
    if( pIter->pLeaf==0 ) break;
    if( bRev==0 && pIter->iRowid>=iMatch ) break;
    if( bRev!=0 && pIter->iRowid<=iMatch ) break;
    bMove = 1;
  }while( p->rc==SQLITE_OK );
}